

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O1

void __thiscall CaDiCaL::Options::print(Options *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  int iVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  int iVar105;
  int iVar106;
  int iVar107;
  int iVar108;
  int iVar109;
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  int iVar114;
  int iVar115;
  int iVar116;
  int iVar117;
  int iVar118;
  int iVar119;
  int iVar120;
  int iVar121;
  int iVar122;
  int iVar123;
  int iVar124;
  int iVar125;
  int iVar126;
  int iVar127;
  int iVar128;
  int iVar129;
  int iVar130;
  int iVar131;
  int iVar132;
  int iVar133;
  int iVar134;
  int iVar135;
  int iVar136;
  int iVar137;
  int iVar138;
  int iVar139;
  int iVar140;
  int iVar141;
  int iVar142;
  int iVar143;
  int iVar144;
  int iVar145;
  int iVar146;
  int iVar147;
  int iVar148;
  int iVar149;
  int iVar150;
  int iVar151;
  int iVar152;
  int iVar153;
  int iVar154;
  int iVar155;
  int iVar156;
  int iVar157;
  int iVar158;
  int iVar159;
  int iVar160;
  int iVar161;
  int iVar162;
  int iVar163;
  int iVar164;
  int iVar165;
  int iVar166;
  int iVar167;
  int iVar168;
  int iVar169;
  int iVar170;
  int iVar171;
  int iVar172;
  int iVar173;
  int iVar174;
  char *pcVar175;
  char *pcVar176;
  uint uVar177;
  char *pcVar178;
  char *pcVar179;
  char *pcVar180;
  char *pcVar181;
  char *pcVar182;
  bool bVar183;
  bool bVar184;
  char buffer [256];
  
  iVar1 = this->arena;
  if (iVar1 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar1 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--arena=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->arena == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar2 = this->arenacompact;
  uVar177 = (iVar1 != 1) + 1;
  if (iVar2 == 1) {
    uVar177 = (uint)(iVar1 != 1);
  }
  if (this->verbose != 0 || iVar2 != 1) {
    pcVar176 = "false";
    if (iVar2 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--arenacompact=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->arenacompact == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar1 = this->arenasort;
  if (iVar1 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar1 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--arenasort=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->arenasort == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar2 = this->arenatype;
  if (iVar2 != 3 || this->verbose != 0) {
    snprintf(buffer,0x100,"--arenatype=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->arenatype == 3;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'3\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar3 = this->binary;
  if (iVar3 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar3 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--binary=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->binary == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar4 = this->block;
  if (this->verbose != 0 || iVar4 != 0) {
    pcVar176 = "true";
    if (iVar4 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--block=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->block == 0;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar5 = this->blockmaxclslim;
  if (iVar5 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--blockmaxclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->blockmaxclslim == 100000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar6 = this->blockminclslim;
  if (iVar6 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--blockminclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->blockminclslim == 2;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar7 = this->blockocclim;
  if (iVar7 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--blockocclim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->blockocclim == 100;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar8 = this->bump;
  if (iVar8 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar8 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--bump=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->bump == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar9 = this->bumpreason;
  if (iVar9 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar9 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--bumpreason=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->bumpreason == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar10 = this->bumpreasondepth;
  if (iVar10 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--bumpreasondepth=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->bumpreasondepth == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar11 = this->check;
  if (this->verbose != 0 || iVar11 != 0) {
    pcVar176 = "true";
    if (iVar11 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--check=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->check == 0;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar12 = this->checkassumptions;
  if (iVar12 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar12 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--checkassumptions=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->checkassumptions == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar13 = this->checkconstraint;
  if (iVar13 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar13 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--checkconstraint=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->checkconstraint == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar14 = this->checkfailed;
  if (iVar14 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar14 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--checkfailed=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->checkfailed == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar15 = this->checkfrozen;
  if (this->verbose != 0 || iVar15 != 0) {
    pcVar176 = "true";
    if (iVar15 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--checkfrozen=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->checkfrozen == 0;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar16 = this->checkproof;
  if (iVar16 != 3 || this->verbose != 0) {
    snprintf(buffer,0x100,"--checkproof=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->checkproof == 3;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'3\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar17 = this->checkwitness;
  if (iVar17 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar17 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--checkwitness=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->checkwitness == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar18 = this->chrono;
  if (iVar18 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--chrono=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->chrono == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar19 = this->chronoalways;
  if (this->verbose != 0 || iVar19 != 0) {
    pcVar176 = "true";
    if (iVar19 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--chronoalways=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->chronoalways == 0;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar20 = this->chronolevelim;
  if (iVar20 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--chronolevelim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->chronolevelim == 100;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar21 = this->chronoreusetrail;
  if (iVar21 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar21 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--chronoreusetrail=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->chronoreusetrail == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar22 = this->compact;
  if (iVar22 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar22 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--compact=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->compact == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar23 = this->compactint;
  if (iVar23 != 2000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--compactint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->compactint == 2000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2e3\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar24 = this->compactlim;
  if (iVar24 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--compactlim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->compactlim == 100;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar25 = this->compactmin;
  if (iVar25 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--compactmin=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->compactmin == 100;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar26 = this->condition;
  if (this->verbose != 0 || iVar26 != 0) {
    pcVar176 = "true";
    if (iVar26 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--condition=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->condition == 0;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar27 = this->conditionint;
  if (iVar27 != 10000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--conditionint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->conditionint == 10000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e4\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar28 = this->conditionmaxeff;
  if (iVar28 != 10000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--conditionmaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->conditionmaxeff == 10000000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e7\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar29 = this->conditionmaxrat;
  if (iVar29 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--conditionmaxrat=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->conditionmaxrat == 100;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'100\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar30 = this->conditionmineff;
  if (iVar30 != 1000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--conditionmineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->conditionmineff == 1000000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e6\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar31 = this->conditionreleff;
  if (iVar31 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--conditionreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->conditionreleff == 100;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'100\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar32 = this->cover;
  if (this->verbose != 0 || iVar32 != 0) {
    pcVar176 = "true";
    if (iVar32 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--cover=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->cover == 0;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar33 = this->covermaxclslim;
  if (iVar33 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--covermaxclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->covermaxclslim == 100000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar34 = this->covermaxeff;
  if (iVar34 != 100000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--covermaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->covermaxeff == 100000000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e8\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar35 = this->coverminclslim;
  if (iVar35 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--coverminclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->coverminclslim == 2;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar36 = this->covermineff;
  if (iVar36 != 1000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--covermineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->covermineff == 1000000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e6\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar37 = this->coverreleff;
  if (iVar37 != 4 || this->verbose != 0) {
    snprintf(buffer,0x100,"--coverreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->coverreleff == 4;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'4\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar38 = this->decompose;
  if (iVar38 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar38 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--decompose=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->decompose == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar39 = this->decomposerounds;
  if (iVar39 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--decomposerounds=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->decomposerounds == 2;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar40 = this->deduplicate;
  if (iVar40 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar40 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--deduplicate=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->deduplicate == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar41 = this->eagersubsume;
  if (iVar41 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar41 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--eagersubsume=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->eagersubsume == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar42 = this->eagersubsumelim;
  if (iVar42 != 0x14 || this->verbose != 0) {
    snprintf(buffer,0x100,"--eagersubsumelim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->eagersubsumelim == 0x14;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'20\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar43 = this->elim;
  if (iVar43 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar43 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--elim=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elim == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar44 = this->elimands;
  if (iVar44 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar44 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--elimands=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elimands == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar45 = this->elimaxeff;
  if (iVar45 != 2000000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elimaxeff == 2000000000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2e9\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar46 = this->elimbackward;
  if (iVar46 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar46 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--elimbackward=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elimbackward == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar47 = this->elimboundmax;
  if (iVar47 != 0x10 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimboundmax=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elimboundmax == 0x10;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'16\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar48 = this->elimboundmin;
  if (this->verbose != 0 || iVar48 != 0) {
    snprintf(buffer,0x100,"--elimboundmin=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elimboundmin == 0;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar49 = this->elimclslim;
  if (iVar49 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elimclslim == 100;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar50 = this->elimequivs;
  if (iVar50 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar50 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--elimequivs=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elimequivs == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar51 = this->elimineff;
  if (iVar51 != 10000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elimineff == 10000000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e7\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar52 = this->elimint;
  if (iVar52 != 2000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elimint == 2000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2e3\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar53 = this->elimites;
  if (iVar53 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar53 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--elimites=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elimites == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar54 = this->elimlimited;
  if (iVar54 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar54 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--elimlimited=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elimlimited == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar55 = this->elimocclim;
  if (iVar55 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimocclim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elimocclim == 100;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar56 = this->elimprod;
  if (iVar56 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimprod=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elimprod == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar57 = this->elimreleff;
  if (iVar57 != 1000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elimreleff == 1000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e3\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar58 = this->elimrounds;
  if (iVar58 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimrounds=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elimrounds == 2;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar59 = this->elimsubst;
  if (iVar59 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar59 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--elimsubst=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elimsubst == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar60 = this->elimsum;
  if (iVar60 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimsum=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elimsum == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar61 = this->elimxorlim;
  if (iVar61 != 5 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimxorlim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elimxorlim == 5;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'5\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar62 = this->elimxors;
  if (iVar62 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar62 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--elimxors=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->elimxors == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar63 = this->emagluefast;
  if (iVar63 != 0x21 || this->verbose != 0) {
    snprintf(buffer,0x100,"--emagluefast=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->emagluefast == 0x21;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'33\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar64 = this->emaglueslow;
  if (iVar64 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--emaglueslow=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->emaglueslow == 100000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar65 = this->emajump;
  if (iVar65 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--emajump=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->emajump == 100000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar66 = this->emalevel;
  if (iVar66 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--emalevel=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->emalevel == 100000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar67 = this->emasize;
  if (iVar67 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--emasize=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->emasize == 100000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar68 = this->ematrailfast;
  if (iVar68 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ematrailfast=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->ematrailfast == 100;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar69 = this->ematrailslow;
  if (iVar69 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ematrailslow=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->ematrailslow == 100000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar70 = this->exteagerreasons;
  if (iVar70 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar70 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--exteagerreasons=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->exteagerreasons == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar71 = this->exteagerrecalc;
  if (iVar71 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar71 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--exteagerrecalc=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->exteagerrecalc == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar72 = this->externallrat;
  if (this->verbose != 0 || iVar72 != 0) {
    pcVar176 = "true";
    if (iVar72 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--externallrat=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->externallrat == 0;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar73 = this->flush;
  if (this->verbose != 0 || iVar73 != 0) {
    pcVar176 = "true";
    if (iVar73 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--flush=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->flush == 0;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar74 = this->flushfactor;
  if (iVar74 != 3 || this->verbose != 0) {
    snprintf(buffer,0x100,"--flushfactor=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->flushfactor == 3;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'3\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar75 = this->flushint;
  if (iVar75 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--flushint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->flushint == 100000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar76 = this->forcephase;
  if (this->verbose != 0 || iVar76 != 0) {
    pcVar176 = "true";
    if (iVar76 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--forcephase=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->forcephase == 0;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar77 = this->frat;
  if (this->verbose != 0 || iVar77 != 0) {
    snprintf(buffer,0x100,"--frat=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->frat == 0;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar78 = this->idrup;
  if (this->verbose != 0 || iVar78 != 0) {
    pcVar176 = "true";
    if (iVar78 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--idrup=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->idrup == 0;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar79 = this->ilb;
  if (this->verbose != 0 || iVar79 != 0) {
    pcVar176 = "true";
    if (iVar79 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--ilb=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->ilb == 0;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar80 = this->ilbassumptions;
  if (this->verbose != 0 || iVar80 != 0) {
    pcVar176 = "true";
    if (iVar80 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--ilbassumptions=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->ilbassumptions == 0;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar81 = this->inprocessing;
  if (iVar81 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar81 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--inprocessing=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->inprocessing == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar82 = this->instantiate;
  if (this->verbose != 0 || iVar82 != 0) {
    pcVar176 = "true";
    if (iVar82 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--instantiate=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->instantiate == 0;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar83 = this->instantiateclslim;
  if (iVar83 != 3 || this->verbose != 0) {
    snprintf(buffer,0x100,"--instantiateclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->instantiateclslim == 3;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'3\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar84 = this->instantiateocclim;
  if (iVar84 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--instantiateocclim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->instantiateocclim == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar85 = this->instantiateonce;
  if (iVar85 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar85 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--instantiateonce=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->instantiateonce == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar86 = this->lidrup;
  if (this->verbose != 0 || iVar86 != 0) {
    pcVar176 = "true";
    if (iVar86 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--lidrup=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->lidrup == 0;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar87 = this->lrat;
  if (this->verbose != 0 || iVar87 != 0) {
    pcVar176 = "true";
    if (iVar87 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--lrat=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->lrat == 0;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar88 = this->lucky;
  if (iVar88 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar88 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--lucky=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->lucky == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar89 = this->minimize;
  if (iVar89 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar89 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--minimize=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->minimize == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar90 = this->minimizedepth;
  if (iVar90 != 1000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--minimizedepth=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->minimizedepth == 1000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e3\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar91 = this->otfs;
  if (iVar91 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar91 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--otfs=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->otfs == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar92 = this->phase;
  if (iVar92 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar92 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--phase=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->phase == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar93 = this->probe;
  if (iVar93 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar93 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--probe=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->probe == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar94 = this->probehbr;
  if (iVar94 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar94 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--probehbr=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->probehbr == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar95 = this->probeint;
  if (iVar95 != 5000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--probeint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->probeint == 5000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'5e3\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar96 = this->probemaxeff;
  if (iVar96 != 100000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--probemaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->probemaxeff == 100000000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e8\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar97 = this->probemineff;
  if (iVar97 != 1000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--probemineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->probemineff == 1000000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e6\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar98 = this->probereleff;
  if (iVar98 != 0x14 || this->verbose != 0) {
    snprintf(buffer,0x100,"--probereleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->probereleff == 0x14;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'20\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar99 = this->proberounds;
  if (iVar99 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--proberounds=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->proberounds == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar100 = this->profile;
  if (iVar100 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--profile=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->profile == 2;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar101 = this->quiet;
  if (this->verbose != 0 || iVar101 != 0) {
    pcVar176 = "true";
    if (iVar101 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--quiet=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->quiet == 0;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar102 = this->radixsortlim;
  if (iVar102 != 0x20 || this->verbose != 0) {
    snprintf(buffer,0x100,"--radixsortlim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->radixsortlim == 0x20;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'32\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar103 = this->realtime;
  if (this->verbose != 0 || iVar103 != 0) {
    pcVar176 = "true";
    if (iVar103 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--realtime=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->realtime == 0;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar104 = this->reduce;
  if (iVar104 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar104 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--reduce=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->reduce == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar105 = this->reduceint;
  if (iVar105 != 300 || this->verbose != 0) {
    snprintf(buffer,0x100,"--reduceint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->reduceint == 300;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'300\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar106 = this->reducetarget;
  if (iVar106 != 0x4b || this->verbose != 0) {
    snprintf(buffer,0x100,"--reducetarget=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->reducetarget == 0x4b;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'75\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar107 = this->reducetier1glue;
  if (iVar107 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--reducetier1glue=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->reducetier1glue == 2;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar108 = this->reducetier2glue;
  if (iVar108 != 6 || this->verbose != 0) {
    snprintf(buffer,0x100,"--reducetier2glue=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->reducetier2glue == 6;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'6\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar109 = this->reluctant;
  if (iVar109 != 0x400 || this->verbose != 0) {
    snprintf(buffer,0x100,"--reluctant=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->reluctant == 0x400;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1024\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar110 = this->reluctantmax;
  if (iVar110 != 0x100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--reluctantmax=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->reluctantmax == 0x100000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1048576\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar111 = this->rephase;
  if (iVar111 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar111 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--rephase=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->rephase == 1;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar112 = this->rephaseint;
  if (iVar112 != 1000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--rephaseint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar183 = (tout[9] & 1) == 0;
      if (bVar183) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar183) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar183) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar183) {
        pcVar181 = "";
      }
      bVar183 = this->rephaseint == 1000;
      pcVar182 = pcVar180;
      if (bVar183) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar183) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e3\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar113 = this->report;
  bVar183 = iVar113 != reportdefault;
  if (bVar183 || this->verbose != 0) {
    pcVar180 = "true";
    pcVar176 = "true";
    if (iVar113 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--report=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar175 = "\x1b[0m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;32m";
      if (bVar184) {
        pcVar181 = "";
      }
      pcVar182 = "\x1b[0;33m";
      if (bVar184) {
        pcVar182 = "";
      }
      bVar184 = this->report == reportdefault;
      pcVar178 = pcVar175;
      if (bVar184) {
        pcVar176 = "";
        pcVar178 = "";
      }
      pcVar179 = "different from";
      if (bVar184) {
        pcVar179 = "same as";
        pcVar182 = pcVar181;
      }
      if (reportdefault == 0) {
        pcVar180 = "false";
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar178,pcVar179,pcVar182,pcVar180,pcVar175);
    }
  }
  iVar113 = this->reportall;
  if (this->verbose != 0 || iVar113 != 0) {
    pcVar176 = "true";
    if (iVar113 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--reportall=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->reportall == 0;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar114 = this->reportsolve;
  if (this->verbose != 0 || iVar114 != 0) {
    pcVar176 = "true";
    if (iVar114 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--reportsolve=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->reportsolve == 0;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar115 = this->restart;
  if (iVar115 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar115 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--restart=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->restart == 1;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar116 = this->restartint;
  if (iVar116 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--restartint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->restartint == 2;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar117 = this->restartmargin;
  if (iVar117 != 10 || this->verbose != 0) {
    snprintf(buffer,0x100,"--restartmargin=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->restartmargin == 10;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'10\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar118 = this->restartreusetrail;
  if (iVar118 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar118 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--restartreusetrail=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->restartreusetrail == 1;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar119 = this->restoreall;
  if (this->verbose != 0 || iVar119 != 0) {
    snprintf(buffer,0x100,"--restoreall=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->restoreall == 0;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar120 = this->restoreflush;
  if (this->verbose != 0 || iVar120 != 0) {
    pcVar176 = "true";
    if (iVar120 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--restoreflush=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->restoreflush == 0;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar121 = this->reverse;
  if (this->verbose != 0 || iVar121 != 0) {
    pcVar176 = "true";
    if (iVar121 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--reverse=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->reverse == 0;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar122 = this->score;
  if (iVar122 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar122 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--score=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->score == 1;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar123 = this->scorefactor;
  if (iVar123 != 0x3b6 || this->verbose != 0) {
    snprintf(buffer,0x100,"--scorefactor=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->scorefactor == 0x3b6;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'950\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar124 = this->seed;
  if (this->verbose != 0 || iVar124 != 0) {
    snprintf(buffer,0x100,"--seed=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->seed == 0;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar125 = this->shrink;
  if (iVar125 != 3 || this->verbose != 0) {
    snprintf(buffer,0x100,"--shrink=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->shrink == 3;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'3\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar126 = this->shrinkreap;
  if (iVar126 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar126 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--shrinkreap=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->shrinkreap == 1;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar127 = this->shuffle;
  if (this->verbose != 0 || iVar127 != 0) {
    pcVar176 = "true";
    if (iVar127 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--shuffle=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->shuffle == 0;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar128 = this->shufflequeue;
  if (iVar128 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar128 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--shufflequeue=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->shufflequeue == 1;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar129 = this->shufflerandom;
  if (this->verbose != 0 || iVar129 != 0) {
    pcVar176 = "true";
    if (iVar129 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--shufflerandom=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->shufflerandom == 0;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar130 = this->shufflescores;
  if (iVar130 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar130 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--shufflescores=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->shufflescores == 1;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar131 = this->stabilize;
  if (iVar131 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar131 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--stabilize=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->stabilize == 1;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar132 = this->stabilizefactor;
  if (iVar132 != 200 || this->verbose != 0) {
    snprintf(buffer,0x100,"--stabilizefactor=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->stabilizefactor == 200;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'200\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar133 = this->stabilizeint;
  if (iVar133 != 1000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--stabilizeint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->stabilizeint == 1000;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e3\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar134 = this->stabilizemaxint;
  if (iVar134 != 2000000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--stabilizemaxint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->stabilizemaxint == 2000000000;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2e9\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar135 = this->stabilizeonly;
  if (this->verbose != 0 || iVar135 != 0) {
    pcVar176 = "true";
    if (iVar135 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--stabilizeonly=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->stabilizeonly == 0;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar136 = this->stats;
  if (this->verbose != 0 || iVar136 != 0) {
    pcVar176 = "true";
    if (iVar136 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--stats=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->stats == 0;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar137 = this->subsume;
  if (iVar137 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar137 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--subsume=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->subsume == 1;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar138 = this->subsumebinlim;
  if (iVar138 != 10000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumebinlim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->subsumebinlim == 10000;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e4\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar139 = this->subsumeclslim;
  if (iVar139 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumeclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->subsumeclslim == 100;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar140 = this->subsumeint;
  if (iVar140 != 10000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumeint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->subsumeint == 10000;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e4\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar141 = this->subsumelimited;
  if (iVar141 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar141 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--subsumelimited=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->subsumelimited == 1;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar142 = this->subsumemaxeff;
  if (iVar142 != 100000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumemaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->subsumemaxeff == 100000000;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e8\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar143 = this->subsumemineff;
  if (iVar143 != 1000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumemineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->subsumemineff == 1000000;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e6\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar144 = this->subsumeocclim;
  if (iVar144 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumeocclim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->subsumeocclim == 100;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar145 = this->subsumereleff;
  if (iVar145 != 1000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumereleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->subsumereleff == 1000;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e3\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar146 = this->subsumestr;
  if (iVar146 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar146 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--subsumestr=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->subsumestr == 1;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar147 = this->target;
  if (iVar147 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--target=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->target == 1;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar148 = this->terminateint;
  if (iVar148 != 10 || this->verbose != 0) {
    snprintf(buffer,0x100,"--terminateint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->terminateint == 10;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'10\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar149 = this->ternary;
  if (iVar149 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar149 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--ternary=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->ternary == 1;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar150 = this->ternarymaxadd;
  if (iVar150 != 1000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ternarymaxadd=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->ternarymaxadd == 1000;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e3\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar151 = this->ternarymaxeff;
  if (iVar151 != 100000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ternarymaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->ternarymaxeff == 100000000;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e8\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar152 = this->ternarymineff;
  if (iVar152 != 1000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ternarymineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->ternarymineff == 1000000;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e6\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar153 = this->ternaryocclim;
  if (iVar153 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ternaryocclim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->ternaryocclim == 100;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar154 = this->ternaryreleff;
  if (iVar154 != 10 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ternaryreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->ternaryreleff == 10;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'10\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar155 = this->ternaryrounds;
  if (iVar155 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ternaryrounds=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->ternaryrounds == 2;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar156 = this->transred;
  if (iVar156 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar156 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--transred=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->transred == 1;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar157 = this->transredmaxeff;
  if (iVar157 != 100000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--transredmaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->transredmaxeff == 100000000;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e8\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar158 = this->transredmineff;
  if (iVar158 != 1000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--transredmineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->transredmineff == 1000000;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e6\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar159 = this->transredreleff;
  if (iVar159 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--transredreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->transredreleff == 100;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar160 = this->verbose;
  if (iVar160 != 0) {
    snprintf(buffer,0x100,"--verbose=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->verbose == 0;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar161 = this->veripb;
  if (this->verbose != 0 || iVar161 != 0) {
    snprintf(buffer,0x100,"--veripb=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->veripb == 0;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar162 = this->vivify;
  if (iVar162 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar162 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--vivify=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->vivify == 1;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar163 = this->vivifyinst;
  if (iVar163 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar163 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--vivifyinst=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->vivifyinst == 1;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar164 = this->vivifymaxeff;
  if (iVar164 != 20000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--vivifymaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->vivifymaxeff == 20000000;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2e7\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar165 = this->vivifymineff;
  if (iVar165 != 20000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--vivifymineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->vivifymineff == 20000;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2e4\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar166 = this->vivifyonce;
  if (this->verbose != 0 || iVar166 != 0) {
    snprintf(buffer,0x100,"--vivifyonce=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->vivifyonce == 0;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar176,buffer,pcVar182
                        ,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar167 = this->vivifyredeff;
  if (iVar167 != 0x4b || this->verbose != 0) {
    snprintf(buffer,0x100,"--vivifyredeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->vivifyredeff == 0x4b;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'75\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar168 = this->vivifyreleff;
  if (iVar168 != 0x14 || this->verbose != 0) {
    snprintf(buffer,0x100,"--vivifyreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->vivifyreleff == 0x14;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'20\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar169 = this->walk;
  if (iVar169 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar169 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--walk=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->walk == 1;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar170 = this->walkmaxeff;
  if (iVar170 != 10000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--walkmaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->walkmaxeff == 10000000;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e7\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar171 = this->walkmineff;
  if (iVar171 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--walkmineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->walkmineff == 100000;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  iVar172 = this->walknonstable;
  if (iVar172 != 1 || this->verbose != 0) {
    pcVar176 = "false";
    if (iVar172 != 0) {
      pcVar176 = "true";
    }
    snprintf(buffer,0x100,"--walknonstable=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->walknonstable == 1;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"true",pcVar180);
    }
  }
  iVar173 = this->walkredundant;
  if (this->verbose != 0 || iVar173 != 0) {
    pcVar176 = "true";
    if (iVar173 == 0) {
      pcVar176 = "false";
    }
    snprintf(buffer,0x100,"--walkredundant=%s",pcVar176);
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->walkredundant == 0;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,"false",pcVar180);
    }
  }
  iVar174 = this->walkreleff;
  if (iVar174 != 0x14 || this->verbose != 0) {
    snprintf(buffer,0x100,"--walkreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar176 = "\x1b[1;33m";
      bVar184 = (tout[9] & 1) == 0;
      if (bVar184) {
        pcVar176 = "";
      }
      pcVar180 = "\x1b[0m";
      if (bVar184) {
        pcVar180 = "";
      }
      pcVar175 = "\x1b[0;32m";
      if (bVar184) {
        pcVar175 = "";
      }
      pcVar181 = "\x1b[0;33m";
      if (bVar184) {
        pcVar181 = "";
      }
      bVar184 = this->walkreleff == 0x14;
      pcVar182 = pcVar180;
      if (bVar184) {
        pcVar176 = "";
        pcVar182 = "";
      }
      pcVar178 = "different from";
      if (bVar184) {
        pcVar178 = "same as";
        pcVar181 = pcVar175;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'20\'%s)",pcVar176,buffer,
                        pcVar182,pcVar178,pcVar181,pcVar180);
    }
  }
  if (((((((((((((((((((((((((((((((((((((((((((((((((((((((uVar177 + (iVar1 != 1) +
                                                            (uint)(iVar2 != 3) + (uint)(iVar3 != 1))
                                                          - (uint)(iVar4 == 0)) +
                                                          (uint)(iVar5 != 100000) +
                                                          (uint)(iVar6 != 2) + (uint)(iVar7 != 100)
                                                          + (uint)(iVar8 != 1) + (uint)(iVar9 != 1)
                                                         + (uint)(iVar10 != 1)) -
                                                        (uint)(iVar11 == 0)) + (uint)(iVar12 != 1) +
                                                        (uint)(iVar13 != 1) + (uint)(iVar14 != 1)) -
                                                      (uint)(iVar15 == 0)) + (uint)(iVar16 != 3) +
                                                      (uint)(iVar17 != 1) + (uint)(iVar18 != 1)) -
                                                    (uint)(iVar19 == 0)) + (uint)(iVar20 != 100) +
                                                    (uint)(iVar21 != 1) + (uint)(iVar22 != 1) +
                                                    (uint)(iVar23 != 2000) + (uint)(iVar24 != 100) +
                                                   (uint)(iVar25 != 100)) - (uint)(iVar26 == 0)) +
                                                  (uint)(iVar27 != 10000) +
                                                  (uint)(iVar28 != 10000000) + (uint)(iVar29 != 100)
                                                  + (uint)(iVar30 != 1000000) +
                                                 (uint)(iVar31 != 100)) - (uint)(iVar32 == 0)) +
                                                (uint)(iVar33 != 100000) +
                                                (uint)(iVar34 != 100000000) + (uint)(iVar35 != 2) +
                                                (uint)(iVar36 != 1000000) + (uint)(iVar37 != 4) +
                                                (uint)(iVar38 != 1) + (uint)(iVar39 != 2) +
                                                (uint)(iVar40 != 1) + (uint)(iVar41 != 1) +
                                                (uint)(iVar42 != 0x14) + (uint)(iVar43 != 1) +
                                                (uint)(iVar44 != 1) + (uint)(iVar45 != 2000000000) +
                                                (uint)(iVar46 != 1) + (uint)(iVar47 != 0x10)) -
                                              (uint)(iVar48 == 0)) + (uint)(iVar49 != 100) +
                                              (uint)(iVar50 != 1) + (uint)(iVar51 != 10000000) +
                                              (uint)(iVar52 != 2000) + (uint)(iVar53 != 1) +
                                              (uint)(iVar54 != 1) + (uint)(iVar55 != 100) +
                                              (uint)(iVar56 != 1) + (uint)(iVar57 != 1000) +
                                              (uint)(iVar58 != 2) + (uint)(iVar59 != 1) +
                                              (uint)(iVar60 != 1) + (uint)(iVar61 != 5) +
                                              (uint)(iVar62 != 1) + (uint)(iVar63 != 0x21) +
                                              (uint)(iVar64 != 100000) + (uint)(iVar65 != 100000) +
                                              (uint)(iVar66 != 100000) + (uint)(iVar67 != 100000) +
                                              (uint)(iVar68 != 100) + (uint)(iVar69 != 100000) +
                                              (uint)(iVar70 != 1) + (uint)(iVar71 != 1)) -
                                            (uint)(iVar72 == 0)) - (uint)(iVar73 == 0)) +
                                           (uint)(iVar74 != 3) + (uint)(iVar75 != 100000)) -
                                         (uint)(iVar76 == 0)) - (uint)(iVar77 == 0)) -
                                       (uint)(iVar78 == 0)) - (uint)(iVar79 == 0)) -
                                     (uint)(iVar80 == 0)) + (uint)(iVar81 != 1)) -
                                   (uint)(iVar82 == 0)) + (uint)(iVar83 != 3) + (uint)(iVar84 != 1)
                                  + (uint)(iVar85 != 1)) - (uint)(iVar86 == 0)) -
                                (uint)(iVar87 == 0)) + (uint)(iVar88 != 1) + (uint)(iVar89 != 1) +
                                (uint)(iVar90 != 1000) + (uint)(iVar91 != 1) + (uint)(iVar92 != 1) +
                                (uint)(iVar93 != 1) + (uint)(iVar94 != 1) + (uint)(iVar95 != 5000) +
                                (uint)(iVar96 != 100000000) + (uint)(iVar97 != 1000000) +
                                (uint)(iVar98 != 0x14) + (uint)(iVar99 != 1) + (uint)(iVar100 != 2))
                              - (uint)(iVar101 == 0)) + (uint)(iVar102 != 0x20)) -
                            (uint)(iVar103 == 0)) + (uint)(iVar104 != 1) + (uint)(iVar105 != 300) +
                            (uint)(iVar106 != 0x4b) + (uint)(iVar107 != 2) + (uint)(iVar108 != 6) +
                            (uint)(iVar109 != 0x400) + (uint)(iVar110 != 0x100000) +
                            (uint)(iVar111 != 1) + (uint)(iVar112 != 1000) + (uint)bVar183) -
                          (uint)(iVar113 == 0)) - (uint)(iVar114 == 0)) + (uint)(iVar115 != 1) +
                         (uint)(iVar116 != 2) + (uint)(iVar117 != 10) + (uint)(iVar118 != 1)) -
                       (uint)(iVar119 == 0)) - (uint)(iVar120 == 0)) - (uint)(iVar121 == 0)) +
                     (uint)(iVar122 != 1) + (uint)(iVar123 != 0x3b6)) - (uint)(iVar124 == 0)) +
                   (uint)(iVar125 != 3) + (uint)(iVar126 != 1)) - (uint)(iVar127 == 0)) +
                (uint)(iVar128 != 1)) - (uint)(iVar129 == 0)) + (uint)(iVar130 != 1) +
               (uint)(iVar131 != 1) + (uint)(iVar132 != 200) + (uint)(iVar133 != 1000) +
              (uint)(iVar134 != 2000000000)) - (uint)(iVar135 == 0)) - (uint)(iVar136 == 0)) +
            (uint)(iVar137 != 1) + (uint)(iVar138 != 10000) + (uint)(iVar139 != 100) +
            (uint)(iVar140 != 10000) + (uint)(iVar141 != 1) + (uint)(iVar142 != 100000000) +
            (uint)(iVar143 != 1000000) + (uint)(iVar144 != 100) + (uint)(iVar145 != 1000) +
            (uint)(iVar146 != 1) + (uint)(iVar147 != 1) + (uint)(iVar148 != 10) +
            (uint)(iVar149 != 1) + (uint)(iVar150 != 1000) + (uint)(iVar151 != 100000000) +
            (uint)(iVar152 != 1000000) + (uint)(iVar153 != 100) + (uint)(iVar154 != 10) +
            (uint)(iVar155 != 2) + (uint)(iVar156 != 1) + (uint)(iVar157 != 100000000) +
            (uint)(iVar158 != 1000000) + (uint)(iVar159 != 100) + (uint)(iVar160 != 0)) -
          (uint)(iVar161 == 0)) + (uint)(iVar162 != 1) + (uint)(iVar163 != 1) +
          (uint)(iVar164 != 20000000) + (uint)(iVar165 != 20000)) - (uint)(iVar166 == 0)) +
        (uint)(iVar167 != 0x4b) + (uint)(iVar168 != 0x14) + (uint)(iVar169 != 1) +
        (uint)(iVar170 != 10000000) + (uint)(iVar171 != 100000) + (uint)(iVar172 != 1) + 0x20) -
       (uint)(iVar173 == 0) == -(uint)(iVar174 != 0x14)) && (this->internal != (Internal *)0x0)) {
    Internal::message(this->internal,"all options are set to their default value");
  }
  return;
}

Assistant:

void Options::print () {
  unsigned different = 0;
#ifdef QUIET
  const bool verbose = false;
#endif
  char buffer[256];
  // We prefer the macro iteration here since '[VLH]' might be '1e9' etc.
#define OPTION(N, V, L, H, O, P, R, D) \
  if (N != (V)) \
    different++; \
  if (verbose || N != (V)) { \
    if ((L) == 0 && (H) == 1) { \
      snprintf (buffer, sizeof buffer, "--" #N "=%s", \
                (N ? "true" : "false")); \
      MSG ("  %s%-30s%s (%s default %s'%s'%s)", \
           ((N == (V)) ? "" : tout.bright_yellow_code ()), buffer, \
           ((N == (V)) ? "" : tout.normal_code ()), \
           ((N == (V)) ? "same as" : "different from"), \
           ((N == (V)) ? tout.green_code () : tout.yellow_code ()), \
           (bool) (V) ? "true" : "false", tout.normal_code ()); \
    } else { \
      snprintf (buffer, sizeof buffer, "--" #N "=%d", N); \
      MSG ("  %s%-30s%s (%s default %s'" #V "'%s)", \
           ((N == (V)) ? "" : tout.bright_yellow_code ()), buffer, \
           ((N == (V)) ? "" : tout.normal_code ()), \
           ((N == (V)) ? "same as" : "different from"), \
           ((N == (V)) ? tout.green_code () : tout.yellow_code ()), \
           tout.normal_code ()); \
    } \
  }
  OPTIONS
#undef OPTION
  if (!different)
    MSG ("all options are set to their default value");
}